

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  *(undefined ***)&this->field_0xb0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0xb8 = 0;
  *(char **)&this->field_0xc0 = "IfcPropertyReferenceValue";
  IfcSimpleProperty::IfcSimpleProperty
            ((IfcSimpleProperty *)this,&PTR_construction_vtable_24__00855718);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).aux_is_derived
  .super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x855688;
  *(undefined8 *)&this->field_0xb0 = 0x855700;
  *(undefined8 *)&this->field_0x58 = 0x8556b0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)0x8556d8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
        field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).field_0x18 =
       0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).field_0x20 = 0
  ;
  this->field_0x98 = 0;
  (this->PropertyReference).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->PropertyReference).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}